

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Inline_Map_AST_Node::eval_internal(Inline_Map_AST_Node *this,Dispatch_State *t_ss)

{
  initializer_list<chaiscript::Boxed_Value> __l;
  bool bVar1;
  element_type *peVar2;
  atomic_uint_fast32_t *t_loc;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar3;
  dispatch_error *e;
  Boxed_Value obj;
  shared_ptr<chaiscript::AST_Node> *child;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  retval;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *in_stack_fffffffffffffdf8;
  Boxed_Value *in_stack_fffffffffffffe00;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe10;
  mapped_type *in_stack_fffffffffffffe20;
  Dispatch_Engine *in_stack_fffffffffffffe28;
  Dispatch_State *in_stack_fffffffffffffe30;
  AST_Node *in_stack_fffffffffffffe38;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *in_stack_fffffffffffffe40;
  Type_Conversions_State *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string *t_name;
  Dispatch_Engine *this_00;
  string local_120 [39];
  undefined1 local_f9 [17];
  string local_e8;
  undefined1 local_b9;
  string local_b8 [80];
  reference local_68;
  shared_ptr<chaiscript::AST_Node> *local_60;
  __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
  local_58;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *local_50;
  Dispatch_State *local_18;
  
  local_18 = in_RDX;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         *)0x24ac0f);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 0x60),0);
  peVar2 = std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x24ac2c);
  local_50 = &peVar2->children;
  local_58._M_current =
       (shared_ptr<chaiscript::AST_Node> *)
       std::
       vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
       ::begin((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)in_stack_fffffffffffffdf8);
  local_60 = (shared_ptr<chaiscript::AST_Node> *)
             std::
             vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             ::end((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                    *)in_stack_fffffffffffffdf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                        *)in_stack_fffffffffffffe00,
                       (__normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
               ::operator*(&local_58);
    peVar2 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x24aca2);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[](&peVar2->children,1);
    std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x24acbb);
    AST_Node::eval(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    bVar1 = Boxed_Value::is_return_value((Boxed_Value *)0x24ace2);
    if (!bVar1) {
      chaiscript::detail::Dispatch_State::operator->((Dispatch_State *)0x24acf7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"clone",(allocator *)&local_b9);
      t_loc = (atomic_uint_fast32_t *)(in_RSI + 0x88);
      t_name = (string *)((long)local_f9 + 1);
      Boxed_Value::Boxed_Value(in_stack_fffffffffffffe00,(Boxed_Value *)in_stack_fffffffffffffdf8);
      local_e8._M_string_length = 1;
      this_00 = (Dispatch_Engine *)local_f9;
      local_e8._0_8_ = t_name;
      std::allocator<chaiscript::Boxed_Value>::allocator
                ((allocator<chaiscript::Boxed_Value> *)0x24ad8a);
      __l._M_len = (size_type)in_stack_fffffffffffffe40;
      __l._M_array = (iterator)in_stack_fffffffffffffe38;
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 in_stack_fffffffffffffe30,__l,(allocator_type *)in_stack_fffffffffffffe28);
      chaiscript::detail::Dispatch_State::conversions(local_18);
      chaiscript::detail::Dispatch_Engine::call_function
                (this_00,t_name,t_loc,
                 (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      Boxed_Value::operator=(in_stack_fffffffffffffe00,(Boxed_Value *)in_stack_fffffffffffffdf8);
      Boxed_Value::~Boxed_Value((Boxed_Value *)0x24ae0c);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                (in_stack_fffffffffffffe10);
      std::allocator<chaiscript::Boxed_Value>::~allocator
                ((allocator<chaiscript::Boxed_Value> *)0x24ae26);
      in_stack_fffffffffffffe50 = (Type_Conversions_State *)((long)local_f9 + 1);
      in_stack_fffffffffffffe58 = (string *)(local_f9 + 0x11);
      do {
        in_stack_fffffffffffffe58 = (string *)((long)in_stack_fffffffffffffe58 + -0x10);
        Boxed_Value::~Boxed_Value((Boxed_Value *)0x24ae4f);
      } while (in_stack_fffffffffffffe58 != (string *)in_stack_fffffffffffffe50);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    in_stack_fffffffffffffe28 =
         chaiscript::detail::Dispatch_State::operator->((Dispatch_State *)0x24af61);
    peVar2 = std::
             __shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x24af73);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[](&peVar2->children,0);
    std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x24af8b);
    AST_Node::eval(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    chaiscript::detail::Dispatch_Engine::boxed_cast<std::__cxx11::string>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe20 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         ::operator[](in_stack_fffffffffffffe40,(key_type *)in_stack_fffffffffffffe38);
    Boxed_Value::operator=(in_stack_fffffffffffffe00,(Boxed_Value *)in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string(local_120);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x24b009);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x24b016);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
    ::operator++(&local_58);
  }
  const_var<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (in_stack_fffffffffffffdf8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          *)0x24b0b5);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          try {
            std::map<std::string, Boxed_Value> retval;

            for (const auto &child : children[0]->children) {
              auto obj = child->children[1]->eval(t_ss);
              if (!obj.is_return_value()) {
                obj = t_ss->call_function("clone", m_loc, {obj}, t_ss.conversions());
              }

              retval[t_ss->boxed_cast<std::string>(child->children[0]->eval(t_ss))] = std::move(obj);
            }

            return const_var(std::move(retval));
          }
          catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Can not find appropriate copy constructor or 'clone' while inserting into Map.", e.parameters, e.functions, false, *t_ss);
          }
        }